

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O0

unique_pointer<const_unsigned_long> __thiscall
pstore::database::getrou<unsigned_long,void>
          (database *this,typed_address<unsigned_long> addr,size_t elements)

{
  value_type vVar1;
  address size;
  _Head_base<0UL,_const_unsigned_long_*,_false> extraout_RDX;
  unique_pointer<const_unsigned_long> uVar2;
  address local_30;
  size_t elements_local;
  database *this_local;
  typed_address<unsigned_long> addr_local;
  
  elements_local = (size_t)addr.a_.a_;
  this_local = (database *)elements;
  addr_local.a_.a_ = (address)(address)this;
  local_30 = typed_address<unsigned_long>::to_address((typed_address<unsigned_long> *)&this_local);
  vVar1 = address::absolute(&stack0xffffffffffffffd0);
  if ((vVar1 & 7) != 0) {
    raise<pstore::error_code>(bad_alignment);
  }
  size = typed_address<unsigned_long>::to_address((typed_address<unsigned_long> *)&this_local);
  getrou((database *)&stack0xffffffffffffffc0,addr.a_.a_,size.a_);
  unique_pointer_cast<unsigned_long_const,void_const>
            ((pstore *)this,(unique_pointer<const_void> *)&stack0xffffffffffffffc0);
  std::unique_ptr<const_void,_void_(*)(const_void_*)>::~unique_ptr
            ((unique_ptr<const_void,_void_(*)(const_void_*)> *)&stack0xffffffffffffffc0);
  uVar2._M_t.super___uniq_ptr_impl<const_unsigned_long,_void_(*)(const_unsigned_long_*)>._M_t.
  super__Tuple_impl<0UL,_const_unsigned_long_*,_void_(*)(const_unsigned_long_*)>.
  super__Head_base<0UL,_const_unsigned_long_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  uVar2._M_t.super___uniq_ptr_impl<const_unsigned_long,_void_(*)(const_unsigned_long_*)>._M_t.
  super__Tuple_impl<0UL,_const_unsigned_long_*,_void_(*)(const_unsigned_long_*)>.
  super__Tuple_impl<1UL,_void_(*)(const_unsigned_long_*)>.
  super__Head_base<1UL,_void_(*)(const_unsigned_long_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(const_unsigned_long_*),_false>)
       (_Head_base<1UL,_void_(*)(const_unsigned_long_*),_false>)this;
  return (unique_pointer<const_unsigned_long>)
         uVar2._M_t.super___uniq_ptr_impl<const_unsigned_long,_void_(*)(const_unsigned_long_*)>._M_t
         .super__Tuple_impl<0UL,_const_unsigned_long_*,_void_(*)(const_unsigned_long_*)>;
}

Assistant:

auto database::getrou (typed_address<T> const addr, std::size_t const elements) const
        -> unique_pointer<T const> {
        if (addr.to_address ().absolute () % alignof (T) != 0) {
            raise (error_code::bad_alignment);
        }
        return unique_pointer_cast<T const> (
            this->getrou (addr.to_address (), sizeof (T) * elements));
    }